

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  ExprList_item *pEVar2;
  sqlite3 *in_RDX;
  ExprList *in_RSI;
  undefined8 *in_RDI;
  ExprList_item *pItem;
  ExprList_item *a;
  sqlite3 *db;
  Expr *in_stack_ffffffffffffffc8;
  sqlite3 *in_stack_ffffffffffffffd0;
  sqlite3 *db_00;
  ExprList *local_18;
  ExprList *local_8;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (in_RSI == (ExprList *)0x0) {
    local_18 = (ExprList *)
               sqlite3DbMallocZero(in_stack_ffffffffffffffd0,(u64)in_stack_ffffffffffffffc8);
    if (local_18 != (ExprList *)0x0) {
      pEVar2 = (ExprList_item *)sqlite3DbMallocRaw(db_00,(u64)in_stack_ffffffffffffffd0);
      local_18->a = pEVar2;
      if (local_18->a != (ExprList_item *)0x0) goto LAB_0016a721;
    }
LAB_0016a76e:
    sqlite3ExprDelete(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    sqlite3ExprListDelete(in_RDX,(ExprList *)db_00);
    local_8 = (ExprList *)0x0;
  }
  else {
    local_18 = in_RSI;
    if ((in_RSI->nExpr & in_RSI->nExpr - 1U) == 0) {
      pEVar2 = (ExprList_item *)
               sqlite3DbRealloc(db_00,in_stack_ffffffffffffffd0,(u64)in_stack_ffffffffffffffc8);
      if (pEVar2 == (ExprList_item *)0x0) {
        in_stack_ffffffffffffffd0 = (sqlite3 *)0x0;
        goto LAB_0016a76e;
      }
      in_RSI->a = pEVar2;
    }
LAB_0016a721:
    iVar1 = local_18->nExpr;
    local_18->nExpr = iVar1 + 1;
    pEVar2 = local_18->a + iVar1;
    memset(pEVar2,0,0x20);
    pEVar2->pExpr = (Expr *)in_RDX;
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(ExprList) );
    if( pList==0 ){
      goto no_mem;
    }
    pList->a = sqlite3DbMallocRaw(db, sizeof(pList->a[0]));
    if( pList->a==0 ) goto no_mem;
  }else if( (pList->nExpr & (pList->nExpr-1))==0 ){
    struct ExprList_item *a;
    assert( pList->nExpr>0 );
    a = sqlite3DbRealloc(db, pList->a, pList->nExpr*2*sizeof(pList->a[0]));
    if( a==0 ){
      goto no_mem;
    }
    pList->a = a;
  }
  assert( pList->a!=0 );
  if( 1 ){
    struct ExprList_item *pItem = &pList->a[pList->nExpr++];
    memset(pItem, 0, sizeof(*pItem));
    pItem->pExpr = pExpr;
  }
  return pList;

no_mem:     
  /* Avoid leaking memory if malloc has failed. */
  sqlite3ExprDelete(db, pExpr);
  sqlite3ExprListDelete(db, pList);
  return 0;
}